

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O3

string * spdlog::details::os::filename_to_str(string *__return_storage_ptr__,filename_t *filename)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (filename->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + filename->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_INLINE std::string filename_to_str(const filename_t &filename)
{
    return filename;
}